

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O2

ssize_t __thiscall
ymfm::opl_registers_base<1>::write(opl_registers_base<1> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint *in_R8;
  
  uVar3 = (ushort)__fd;
  if (0xff < uVar3) {
    __assert_fail("index < REGISTERS",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/chips/ymfm/ymfm_opl.cpp"
                  ,0xc5,
                  "bool ymfm::opl_registers_base<1>::write(uint16_t, uint8_t, uint32_t &, uint32_t &) [Revision = 1]"
                 );
  }
  uVar2 = (uint8_t)__buf;
  if (uVar3 == 4) {
    if ((char)uVar2 < '\0') {
      this->m_regdata[4] = this->m_regdata[4] | 0x80;
    }
    else {
      this->m_regdata[4] = uVar2;
    }
    return 0;
  }
  this->m_regdata[(ulong)(uint)__fd & 0xffff] = uVar2;
  if (uVar3 == 0xbd) {
    *(undefined4 *)__n = 0xff;
    uVar1 = (uint)__buf & 0xff;
    uVar1 = (int)(uVar1 << 0x1a) >> 0x1f & uVar1 & 0x1f;
  }
  else {
    if ((__fd & 0xf0U) != 0xb0) {
      return 0;
    }
    *(uint *)__n = __fd & 0xfU;
    if (8 < (__fd & 0xfU)) {
      return 0;
    }
    uVar1 = 0xf;
    if (((ulong)__buf & 0x20) == 0) {
      uVar1 = 0;
    }
  }
  *in_R8 = uVar1;
  return 1;
}

Assistant:

bool opl_registers_base<Revision>::write(uint16_t index, uint8_t data, uint32_t &channel, uint32_t &opmask)
{
	assert(index < REGISTERS);

	// writes to the mode register with high bit set ignore the low bits
	if (index == REG_MODE && bitfield(data, 7) != 0)
		m_regdata[index] |= 0x80;
	else
		m_regdata[index] = data;

	// handle writes to the rhythm keyons
	if (index == 0xbd)
	{
		channel = RHYTHM_CHANNEL;
		opmask = bitfield(data, 5) ? bitfield(data, 0, 5) : 0;
		return true;
	}

	// handle writes to the channel keyons
	if ((index & 0xf0) == 0xb0)
	{
		channel = index & 0x0f;
		if (channel < 9)
		{
			if (IsOpl3Plus)
				channel += 9 * bitfield(index, 8);
			opmask = bitfield(data, 5) ? 15 : 0;
			return true;
		}
	}
	return false;
}